

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O0

unit_data __thiscall units::detail::unit_data::inv(unit_data *this)

{
  uint *in_RDI;
  unit_data local_34;
  
  unit_data(&local_34,-((int)(*in_RDI << 0x1c) >> 0x1c),-((int)(*in_RDI << 0x15) >> 0x1d),
            -((int)(*in_RDI << 0x18) >> 0x1c),-((int)(*in_RDI << 0x12) >> 0x1d),
            -((int)(*in_RDI << 0xd) >> 0x1d),-((int)(*in_RDI << 0xb) >> 0x1e),
            -((int)(*in_RDI << 0x10) >> 0x1e),-((int)(*in_RDI << 6) >> 0x1e),
            -((int)(*in_RDI << 4) >> 0x1e),-((int)(*in_RDI << 8) >> 0x1d),*in_RDI >> 0x1c & 1,
            *in_RDI >> 0x1d & 1,*in_RDI >> 0x1e & 1,*in_RDI >> 0x1f);
  return local_34;
}

Assistant:

constexpr unit_data inv() const
        {
            return {
                -meter_,
                -kilogram_,
                -second_,
                -ampere_,
                -kelvin_,
                -mole_,
                -candela_,
                -currency_,
                -count_,
                -radians_,
                per_unit_,
                i_flag_,
                e_flag_,
                equation_};
        }